

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkTraversalsCache.cpp
# Opt level: O0

void __thiscall iDynTree::LinkTraversalsCache::deleteTraversals(LinkTraversalsCache *this)

{
  value_type pTVar1;
  Traversal *pTVar2;
  reference ppTVar3;
  vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_> *in_RDI;
  vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_> *unaff_retaddr;
  size_t link;
  Traversal *this_00;
  Traversal *local_10;
  vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_> *__new_size;
  
  local_10 = (Traversal *)0x0;
  __new_size = in_RDI;
  while( true ) {
    this_00 = local_10;
    pTVar2 = (Traversal *)
             std::vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::size
                       (in_RDI);
    if (pTVar2 <= this_00) break;
    ppTVar3 = std::vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::operator[]
                        (in_RDI,(size_type)local_10);
    pTVar1 = *ppTVar3;
    if (pTVar1 != (value_type)0x0) {
      Traversal::~Traversal(this_00);
      operator_delete(pTVar1,0x60);
    }
    local_10 = (Traversal *)
               ((long)&(local_10->links).
                       super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  std::vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::resize
            (unaff_retaddr,(size_type)__new_size);
  return;
}

Assistant:

void LinkTraversalsCache::deleteTraversals()
{
    for(size_t link=0; link < m_linkTraversals.size(); link++)
    {
        delete m_linkTraversals[link];
    }
    m_linkTraversals.resize(0);
}